

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void upb_Map_Freeze(upb_Map *map,upb_MiniTable *m)

{
  _Bool _Var1;
  undefined1 local_40 [8];
  upb_MessageValue val;
  upb_MessageValue key;
  size_t iter;
  upb_MiniTable *m_local;
  upb_Map *map_local;
  
  iter = (size_t)m;
  m_local = (upb_MiniTable *)map;
  _Var1 = upb_Map_IsFrozen(map);
  if ((!_Var1) &&
     (_upb_Map_ShallowFreeze_dont_copy_me__upb_internal_use_only((upb_Map *)m_local), iter != 0)) {
    key.str_val.size = 0xffffffffffffffff;
    while (_Var1 = upb_Map_Next((upb_Map *)m_local,(upb_MessageValue *)&val.str_val.size,
                                (upb_MessageValue *)local_40,&key.str_val.size), _Var1) {
      upb_Message_Freeze((upb_Message *)local_40,(upb_MiniTable *)iter);
    }
  }
  return;
}

Assistant:

void upb_Map_Freeze(upb_Map* map, const upb_MiniTable* m) {
  if (upb_Map_IsFrozen(map)) return;
  UPB_PRIVATE(_upb_Map_ShallowFreeze)(map);

  if (m) {
    size_t iter = kUpb_Map_Begin;
    upb_MessageValue key, val;

    while (upb_Map_Next(map, &key, &val, &iter)) {
      upb_Message_Freeze((upb_Message*)val.msg_val, m);
    }
  }
}